

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall
duckdb_re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar5;
  ostringstream local_1a8 [376];
  char *pcVar4;
  
  pcVar3 = rewrite->data_;
  pcVar5 = pcVar3 + rewrite->size_;
  do {
    if (pcVar5 <= pcVar3) {
LAB_01b14540:
      return pcVar5 <= pcVar3;
    }
    if (*pcVar3 != '\\') {
      std::__cxx11::string::push_back((char)out);
      pcVar4 = pcVar3;
      goto LAB_01b1448d;
    }
    pcVar4 = pcVar3 + 1;
    if (pcVar5 <= pcVar4) {
LAB_01b14492:
      if ((this->options_).log_errors_ == true) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        poVar2 = std::operator<<((ostream *)local_1a8,"invalid rewrite pattern: ");
        std::operator<<(poVar2,rewrite->data_);
LAB_01b1453b:
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      goto LAB_01b14540;
    }
    uVar1 = (int)*pcVar4 - 0x30;
    if (uVar1 < 10) {
      if (veclen <= (int)uVar1) {
        if ((this->options_).log_errors_ == true) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          poVar2 = std::operator<<((ostream *)local_1a8,"invalid substitution \\");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
          poVar2 = std::operator<<(poVar2," from ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,veclen);
          std::operator<<(poVar2," groups");
          goto LAB_01b1453b;
        }
        goto LAB_01b14540;
      }
      if (vec[uVar1].size_ != 0) {
        std::__cxx11::string::append((char *)out,(ulong)vec[uVar1].data_);
      }
    }
    else {
      if (*pcVar4 != '\\') goto LAB_01b14492;
      std::__cxx11::string::push_back((char)out);
    }
LAB_01b1448d:
    pcVar3 = pcVar4 + 1;
  } while( true );
}

Assistant:

bool RE2::Rewrite(std::string* out,
                  const StringPiece& rewrite,
                  const StringPiece* vec,
                  int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "invalid substitution \\" << n
                     << " from " << veclen << " groups";
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (!snip.empty())
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}